

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeTableCopy<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Name *destTable_00;
  Name *srcTable_00;
  bool bVar1;
  allocator<char> local_171;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  MaybeResult<wasm::Name> _val_1;
  MaybeResult<wasm::Name> srcTable;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> destTable;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeTableidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_78,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_90 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_78);
  bVar1 = local_90 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_78);
  if (!bVar1) {
    maybeTableidx<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::Name> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),ctx);
    MaybeResult<wasm::Name>::MaybeResult
              ((MaybeResult<wasm::Name> *)&err_1,
               (MaybeResult<wasm::Name> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    local_110 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)&err_1);
    bVar1 = local_110 == (Err *)0x0;
    if (!bVar1) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)&err_1);
    if (bVar1) {
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
      if ((!bVar1) ||
         (bVar1 = wasm::MaybeResult::operator_cast_to_bool
                            ((MaybeResult *)
                             ((long)&_val_1.val.
                                     super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> +
                             0x20)), bVar1)) {
        destTable_00 = MaybeResult<wasm::Name>::getPtr
                                 ((MaybeResult<wasm::Name> *)
                                  ((long)&_val.val.
                                          super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>
                                          .super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>
                                          .super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>
                                  + 0x20));
        srcTable_00 = MaybeResult<wasm::Name>::getPtr
                                ((MaybeResult<wasm::Name> *)
                                 ((long)&_val_1.val.
                                         super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>
                                         .super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> +
                                 0x20));
        ParseDefsCtx::makeTableCopy
                  (__return_storage_ptr__,ctx,pos,annotations,destTable_00,srcTable_00);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"expected table index or identifier",&local_171);
        Lexer::err(&local_150,&ctx->in,&local_170);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_150);
        wasm::Err::~Err(&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
      }
    }
    MaybeResult<wasm::Name>::~MaybeResult
              ((MaybeResult<wasm::Name> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeTableCopy(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto destTable = maybeTableidx(ctx);
  CHECK_ERR(destTable);
  auto srcTable = maybeTableidx(ctx);
  CHECK_ERR(srcTable);
  if (destTable && !srcTable) {
    return ctx.in.err("expected table index or identifier");
  }
  return ctx.makeTableCopy(
    pos, annotations, destTable.getPtr(), srcTable.getPtr());
}